

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

OrderedPortConnectionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::OrderedPortConnectionSyntax,slang::syntax::OrderedPortConnectionSyntax_const&>
          (BumpAllocator *this,OrderedPortConnectionSyntax *args)

{
  OrderedPortConnectionSyntax *pOVar1;
  OrderedPortConnectionSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pOVar1 = (OrderedPortConnectionSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::OrderedPortConnectionSyntax::OrderedPortConnectionSyntax(in_RSI,pOVar1);
  return pOVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }